

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O1

bool __thiscall
Lib::Set<Kernel::OperatorType*,Kernel::OperatorType::TypeHash>::find<Kernel::OperatorType*>
          (Set<Kernel::OperatorType*,Kernel::OperatorType::TypeHash> *this,OperatorType *key,
          OperatorType **result)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  
  uVar2 = Kernel::OperatorType::TypeHash::hash(key);
  uVar4 = 2;
  if (2 < uVar2) {
    uVar4 = uVar2;
  }
  lVar3 = ((ulong)uVar4 % (ulong)*(uint *)this) * 0x10;
  uVar2 = *(uint *)(*(long *)(this + 0x10) + lVar3);
  bVar6 = uVar2 != 0;
  if (bVar6) {
    puVar5 = (uint *)(*(long *)(this + 0x10) + lVar3);
    do {
      if ((uVar2 == uVar4) &&
         (bVar1 = Kernel::OperatorType::TypeHash::equals(*(OperatorType **)(puVar5 + 2),key), bVar1)
         ) {
        *result = *(OperatorType **)(puVar5 + 2);
        return bVar6;
      }
      puVar5 = puVar5 + 4;
      if (puVar5 == *(uint **)(this + 0x18)) {
        puVar5 = *(uint **)(this + 0x10);
      }
      uVar2 = *puVar5;
      bVar6 = uVar2 != 0;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool find(Key key, Val& result) const
  {
    unsigned code = Hash::hash(key);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,key)) {
	result=cell->value;
	return true;
      }
    }
    return false;
  }